

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

optional<std::vector<int,_std::allocator<int>_>_> *
pbrt::SplitStringToInts
          (optional<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,string_view str
          ,char ch)

{
  bool bVar1;
  undefined7 in_register_00000009;
  char in_R8B;
  long lVar2;
  int *piVar3;
  string_view str_00;
  string_view str_01;
  vector<int,_std::allocator<int>_> ints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  allocator_type local_49;
  undefined1 local_48 [16];
  pointer local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  str_01._M_str = (int *)CONCAT71(in_register_00000009,ch);
  str_01._M_len = str._M_str;
  SplitString_abi_cxx11_(&local_30,(pbrt *)str._M_len,str_01,in_R8B);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,
             (long)local_30.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_30.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,&local_49);
  if (local_30.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_30.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    piVar3 = (int *)0x0;
    do {
      str_00._M_str = (char *)(local_48._0_8_ + lVar2);
      str_00._M_len =
           (size_t)(&(local_30.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar2]._M_p;
      bVar1 = Atoi((pbrt *)(&(local_30.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)[lVar2],
                   str_00,str_01._M_str);
      if (!bVar1) {
        (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
        *(undefined8 *)&__return_storage_ptr__->set = 0;
        goto LAB_0030c8d6;
      }
      piVar3 = (int *)((long)piVar3 + 1);
      str_01._M_str =
           (int *)((long)local_30.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
      lVar2 = lVar2 + 4;
    } while (piVar3 < str_01._M_str);
  }
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)local_48._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_48._8_8_;
  *(pointer *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_38;
  local_48 = ZEXT816(0) << 0x20;
  local_38 = (pointer)0x0;
LAB_0030c8d6:
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<std::vector<int>> SplitStringToInts(std::string_view str, char ch) {
    std::vector<std::string> strs = SplitString(str, ch);
    std::vector<int> ints(strs.size());

    for (size_t i = 0; i < strs.size(); ++i)
        if (!Atoi(strs[i], &ints[i]))
            return {};
    return ints;
}